

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall CTcTokenizer::read_line(CTcTokenizer *this,int append)

{
  ulong *puVar1;
  CTcTokStream *pCVar2;
  CTcSrcObject *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  iVar4 = -1;
  if (this->str_ != (CTcTokStream *)0x0) {
    if (append == 0) {
      (this->linebuf_).buf_len_ = 0;
      if ((this->linebuf_).buf_size_ != 0) {
        *(this->linebuf_).buf_ = '\0';
      }
      pCVar2 = this->str_;
      (this->p_).p_ = (this->linebuf_).buf_;
      this->last_desc_ = pCVar2->desc_;
      this->last_linenum_ = pCVar2->next_linenum_;
    }
    uVar10 = (this->linebuf_).buf_len_;
    sVar6 = (this->unsplicebuf_).buf_len_;
    if (sVar6 == 0) {
      uVar9 = uVar10;
      if (append != 0) {
        this->appended_desc_ = this->str_->desc_;
        this->appended_linenum_ = this->str_->next_linenum_;
      }
LAB_0022049d:
      do {
        pCVar3 = this->str_->src_;
        iVar4 = (*pCVar3->_vptr_CTcSrcObject[2])
                          (pCVar3,(this->linebuf_).buf_ + uVar9,(this->linebuf_).buf_size_ - uVar9);
        if (CONCAT44(extraout_var,iVar4) == 0) {
          lVar8 = 2;
          if (uVar9 <= uVar10) {
            while( true ) {
              pCVar2 = this->str_;
              if (this->if_sp_ <= pCVar2->init_if_level_) break;
              pcVar5 = (this->if_stack_[this->if_sp_ + -1].desc)->fname_;
              if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x8) !=
                  (undefined1  [3440])0x0) {
                pcVar5 = os_get_root_name(pcVar5);
              }
              lVar8 = this->if_stack_[(long)this->if_sp_ + -1].linenum;
              sVar6 = strlen(pcVar5);
              log_error(0x273c,lVar8,sVar6 & 0xffffffff,pcVar5);
              if (this->if_false_level_ != 0) {
                this->if_false_level_ = this->if_false_level_ + -1;
              }
              if (this->if_sp_ != 0) {
                this->if_sp_ = this->if_sp_ + -1;
              }
            }
            this->str_ = pCVar2->parent_;
            if (pCVar2->src_ != (CTcSrcObject *)0x0) {
              (*pCVar2->src_->_vptr_CTcSrcObject[1])();
            }
            operator_delete(pCVar2,0x30);
            if ((append == 0) && (pCVar2 = this->str_, pCVar2 != (CTcTokStream *)0x0)) {
              this->last_desc_ = pCVar2->desc_;
              this->last_linenum_ = pCVar2->next_linenum_;
            }
            if (this->str_ != (CTcTokStream *)0x0) {
              this->string_newline_spacing_ = this->str_->newline_spacing_;
              iVar4 = (*(code *)0x22049d)();
              return iVar4;
            }
            lVar8 = 1;
          }
LAB_002206bf:
          iVar4 = (*(code *)((long)&DAT_002c15b0 + (long)(int)(&DAT_002c15b0)[lVar8]))();
          return iVar4;
        }
        lVar8 = uVar9 + CONCAT44(extraout_var,iVar4);
        uVar9 = lVar8 - 1;
        (this->linebuf_).buf_len_ = uVar9;
        if (uVar9 < (this->linebuf_).buf_size_) {
          (this->linebuf_).buf_[uVar9] = '\0';
        }
        if ((uVar9 != 0) && ((this->linebuf_).buf_[lVar8 + -2] != '\n')) {
          iVar4 = (*this->str_->src_->_vptr_CTcSrcObject[3])();
          lVar8 = 0;
          if (iVar4 != 0) goto LAB_002206bf;
          (*(this->linebuf_)._vptr_CTcTokString[2])
                    (&this->linebuf_,(this->linebuf_).buf_size_ + 0x1000);
          goto LAB_0022049d;
        }
        if ((uVar9 < 2) || (pcVar5 = (this->linebuf_).buf_, pcVar5[lVar8 + -3] != '\\')) {
          if (uVar9 != 0) {
            uVar10 = lVar8 - 2;
            (this->linebuf_).buf_len_ = uVar10;
            if (uVar10 < (this->linebuf_).buf_size_) {
              (this->linebuf_).buf_[uVar10] = '\0';
            }
          }
          puVar1 = &this->str_->next_linenum_;
          *puVar1 = *puVar1 + 1;
          lVar8 = 2;
          goto LAB_002206bf;
        }
        uVar9 = lVar8 - 3;
        (this->linebuf_).buf_len_ = uVar9;
        if (uVar9 < (this->linebuf_).buf_size_) {
          pcVar5[uVar9] = '\0';
        }
        puVar1 = &this->str_->next_linenum_;
        *puVar1 = *puVar1 + 1;
      } while( true );
    }
    pcVar5 = (this->unsplicebuf_).buf_;
    (*(this->linebuf_)._vptr_CTcTokString[2])(&this->linebuf_,uVar10 + sVar6);
    memcpy((this->linebuf_).buf_ + (this->linebuf_).buf_len_,pcVar5,sVar6);
    sVar7 = sVar6 + (this->linebuf_).buf_len_;
    (this->linebuf_).buf_len_ = sVar7;
    (this->linebuf_).buf_[sVar7] = '\0';
    (this->unsplicebuf_).buf_len_ = 0;
    if ((this->unsplicebuf_).buf_size_ != 0) {
      *(this->unsplicebuf_).buf_ = '\0';
    }
    this->last_desc_ = this->appended_desc_;
    this->last_linenum_ = this->appended_linenum_;
    iVar4 = (int)uVar10;
  }
  return iVar4;
}

Assistant:

int CTcTokenizer::read_line(int append)
{
    /* if there's no input stream, indicate end-of-file */
    if (str_ == 0)
        return -1;

    /* if we're not appending, clear out the line buffer */
    if (!append)
    {
        /* start with an empty line */
        clear_linebuf();

        /* note the current input position */
        last_desc_ = str_->get_desc();
        last_linenum_ = str_->get_next_linenum();
    }

    /* note where the new data starts */
    size_t len = linebuf_.get_text_len();
    size_t start_len = len;

    /* 
     *   if there's anything in the unsplice buffer, use it as the new
     *   line 
     */
    if (unsplicebuf_.get_text_len() != 0)
    {
        /* 
         *   Copy the unsplice buffer as the current line.  Note that we
         *   don't have to worry about any of the complicated cases, such
         *   as whether or not it ends with a newline or a backslash,
         *   because the unspliced line was already processed as an input
         *   line when we read it in the first place. 
         */
        linebuf_.append(unsplicebuf_.get_text(), unsplicebuf_.get_text_len());
        
        /* clear the unsplice buffer, since it's been consumed now */
        unsplicebuf_.clear_text();

        /* 
         *   make the current line the appended line - if we're
         *   unsplicing, it means that we appended, so the current line is
         *   now the line from which the last appended text came 
         */
        last_desc_ = appended_desc_;
        last_linenum_ = appended_linenum_;

        /* return the offset of the new text */
        return start_len;
    }

    /* if we're appending, note where the appendage is coming from */
    if (append)
    {
        /* remember the last source line appended */
        appended_desc_ = str_->get_desc();
        appended_linenum_ = str_->get_next_linenum();
    }

    /* keep going until we finish reading the input line */
    for ( ;; )
    {
        /* read a line of text from the input file */
        size_t curlen = str_->get_src()->read_line(
            linebuf_.get_buf() + len, linebuf_.get_buf_size() - len);

        /* check for end of file */
        if (curlen == 0)
        {
            /*
             *   We've reached the end of the current input stream.  If
             *   we've already read anything into the current line, it
             *   means that the file ended in mid-line, without a final
             *   newline character; ignore this and proceed with the line
             *   as it now stands in this case.  
             */
            if (len > start_len)
                break;

            /* 
             *   We've finished with this stream.  If there's a parent
             *   stream, return to it; otherwise, we're at the end of the
             *   source.  
             */

            /* 
             *   if we didn't close all of the #if/#ifdef levels opened
             *   within this file, flag one or more errors 
             */
            while (if_sp_ > str_->get_init_if_level())
            {
                /* get the filename from the #if stack */
                const char *fname = if_stack_[if_sp_ - 1].desc->get_fname();

                /* if we're in test reporting mode, use the root name only */
                if (test_report_mode_)
                    fname = os_get_root_name((char *)fname);

                /* log the error */
                log_error(TCERR_IF_WITHOUT_ENDIF,
                          if_stack_[if_sp_ - 1].linenum,
                          (int)strlen(fname), fname);

                /* discard the #if level */
                pop_if();
            }

            /* remember the old stream */
            CTcTokStream *old_str = str_;

            /* return to the parent stream, if there is one */
            str_ = str_->get_parent();

            /* delete the old stream now that we're done with it */
            delete old_str;

            /* note the new file the line will be coming from */
            if (!append && str_ != 0)
            {
                last_desc_ = str_->get_desc();
                last_linenum_ = str_->get_next_linenum();
            }

            /* if there's no stream, return end of file */
            if (str_ == 0)
                return -1;

            /* 
             *   restore the #pragma newline_spacing mode that was in effect
             *   when we interrupted the parent stream 
             */
            string_newline_spacing_ = str_->get_newline_spacing();

            /* if there's a parser, notify it of the new pragma C mode */
#if 0 // #pragma C is not currently used
            if (G_prs != 0)
                G_prs->set_pragma_c(str_->is_pragma_c());
#endif

            /* go back to read the next line from the parent */
            continue;
        }

        /* set the new length of the buffer contents */
        len += curlen - 1;
        linebuf_.set_text_len(len);

        /*
         *   Check the result to see if it ends in a newline.  If not, it
         *   means either that we don't have room in the buffer for the
         *   full source line, or we've reached the last line in the file,
         *   and it doesn't end with a newline.
         *   
         *   Note that the file reader will always supply us with '\n'
         *   newlines, regardless of the local operating system
         *   conventions.
         *   
         *   Also, check to see if the line ends with '\\'.  If so, remove
         *   the '\\' character and read the next line, since this
         *   indicates that the logical line continues onto the next
         *   newline-deliminted line.  
         */
        if (len != 0 && linebuf_.get_text()[len - 1] != '\n')
        {
            /* 
             *   There's no newline, hence the file reader wasn't able to
             *   fit the entire line into our buffer, or else we've read
             *   the last line in the file and there's no newline at the
             *   end.  If we haven't reached the end of the file, expand
             *   our line buffer to make room to read more from this same
             *   line.  
             */
            if (!str_->get_src()->at_eof())
                linebuf_.expand();
        }
        else if (len > 1 && linebuf_.get_text()[len - 2] == '\\')
        {
            /* 
             *   There's a backslash at the end of the line, so they want
             *   to continue this logical line.  Remove the backslash, and
             *   read the next line onto the end of the current line.
             *   
             *   Note that we must remove two characters from the end of
             *   the line (and tested for buf_[len-2] above) because we
             *   have both a backslash and a newline at the end of the
             *   line.  
             */
            len -= 2;
            linebuf_.set_text_len(len);

            /* count reading the physical line */
            str_->count_line();
        }
        else
        {
            /* remove the newline from the buffer */
            if (len != 0)
            {
                --len;
                linebuf_.set_text_len(len);
            }
            
            /* count reading the line */
            str_->count_line();

            /* done */
            break;
        }
    }

    /* 
     *   remove comments from the newly-read material - this replaces each
     *   comment by a single whitespace character 
     */
    process_comments(start_len);

    /* 
     *   we've successfully read a line -- return the offset of the start of
     *   the newly-read text 
     */
    return start_len;
}